

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::FindBestWindowPosForPopupEx
                 (ImVec2 *ref_pos,ImVec2 *size,ImGuiDir *last_dir,ImRect *r_outer,ImRect *r_avoid,
                 ImGuiPopupPositionPolicy policy)

{
  undefined8 uVar1;
  int iVar2;
  ImVec2 IVar3;
  bool bVar4;
  int *piVar5;
  uint *puVar6;
  uint *puVar7;
  long lVar8;
  int *piVar9;
  uint uVar10;
  uint uVar11;
  ImVec2 IVar12;
  ImVec2 IVar13;
  ImVec2 IVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar20;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar21;
  float local_68;
  float fStack_64;
  ImRect local_40;
  
  IVar12.x = (r_outer->Max).x - size->x;
  IVar12.y = (r_outer->Max).y - size->y;
  IVar12 = ImClamp(ref_pos,&r_outer->Min,IVar12);
  if (policy == ImGuiPopupPositionPolicy_ComboBox) {
    piVar9 = (int *)(&DAT_0016b2d0 + (ulong)(*last_dir != -1) * -4);
    for (lVar8 = -4 - (ulong)(*last_dir != -1); lVar8 != 0; lVar8 = lVar8 + 1) {
      piVar5 = piVar9;
      if (lVar8 == -5) {
        piVar5 = last_dir;
      }
      iVar2 = *piVar5;
      if ((lVar8 == -5) || (iVar2 != *last_dir)) {
        switch(iVar2) {
        case 0:
          fVar20 = (r_avoid->Max).x - size->x;
          fVar17 = (r_avoid->Max).y;
          break;
        case 1:
          fVar20 = (r_avoid->Min).x;
          fVar17 = (r_avoid->Min).y - size->y;
          break;
        case 2:
          uVar1 = *(undefined8 *)&(r_avoid->Min).y;
          fVar20 = (float)((ulong)uVar1 >> 0x20) - (*size).x;
          fVar17 = (float)uVar1 - (*size).y;
          break;
        case 3:
          fVar20 = (r_avoid->Min).x;
          fVar17 = (r_avoid->Max).y;
          break;
        default:
          fVar20 = 0.0;
          fVar17 = 0.0;
        }
        local_40.Max.x = (*size).x + fVar20;
        local_40.Max.y = (*size).y + fVar17;
        local_40.Min.x = fVar20;
        local_40.Min.y = fVar17;
        bVar4 = ImRect::Contains(r_outer,&local_40);
        if (bVar4) {
          *last_dir = iVar2;
          IVar3.y = fVar17;
          IVar3.x = fVar20;
          return IVar3;
        }
      }
      piVar9 = piVar9 + 1;
    }
  }
  if ((policy & ~ImGuiPopupPositionPolicy_Tooltip) == ImGuiPopupPositionPolicy_Default) {
    uVar10 = *last_dir;
    fVar17 = (r_avoid->Min).y;
    local_68 = (r_avoid->Max).x;
    fVar20 = (r_outer->Min).x;
    fVar15 = (r_outer->Min).y;
    fStack_64 = (r_avoid->Max).y;
    puVar7 = (uint *)(&DAT_0016cd20 + (ulong)(uVar10 != 0xffffffff) * -4);
    for (lVar8 = -4 - (ulong)(uVar10 != 0xffffffff); lVar8 != 0; lVar8 = lVar8 + 1) {
      puVar6 = (uint *)last_dir;
      if (lVar8 != -5) {
        puVar6 = puVar7;
      }
      uVar11 = *puVar6;
      if ((lVar8 == -5) || (uVar11 != uVar10)) {
        fVar16 = (r_avoid->Min).x;
        if (uVar11 != 0) {
          fVar16 = (r_outer->Max).x;
        }
        fVar21 = local_68;
        if (uVar11 != 1) {
          fVar21 = fVar20;
        }
        if (size->x <= fVar16 - fVar21 || 1 < uVar11) {
          fVar16 = fVar17;
          if (uVar11 != 2) {
            fVar16 = (r_outer->Max).y;
          }
          fVar21 = fStack_64;
          if (uVar11 != 3) {
            fVar21 = fVar15;
          }
          if ((size->y <= fVar16 - fVar21) || ((uVar11 & 0xfffffffe) != 2)) {
            if (uVar11 == 0) {
              local_68 = (r_avoid->Min).x - size->x;
            }
            else if (uVar11 != 1) {
              local_68 = IVar12.x;
              if (uVar11 == 2) {
                fStack_64 = fVar17 - size->y;
                goto LAB_0012ccf4;
              }
              if (uVar11 == 3) goto LAB_0012ccf4;
            }
            fStack_64 = IVar12.y;
LAB_0012ccf4:
            IVar14.x = (float)(~-(uint)(fVar20 <= local_68) & (uint)fVar20 |
                              (uint)local_68 & -(uint)(fVar20 <= local_68));
            IVar14.y = (float)(~-(uint)(fVar15 <= fStack_64) & (uint)fVar15 |
                              (uint)fStack_64 & -(uint)(fVar15 <= fStack_64));
            *last_dir = uVar11;
            return IVar14;
          }
        }
      }
      puVar7 = puVar7 + 1;
    }
  }
  *last_dir = -1;
  if (policy == ImGuiPopupPositionPolicy_Tooltip) {
    IVar13.x = (*ref_pos).x + 2.0;
    IVar13.y = (*ref_pos).y + 2.0;
  }
  else {
    fVar17 = (*size).x;
    auVar18._0_4_ = (*ref_pos).x + fVar17;
    fVar20 = (*size).y;
    auVar18._4_4_ = (*ref_pos).y + fVar20;
    auVar18._8_8_ = 0;
    fVar15 = (r_outer->Min).x;
    fVar16 = (r_outer->Min).y;
    auVar19._8_8_ = 0;
    auVar19._0_4_ = (r_outer->Max).x;
    auVar19._4_4_ = (r_outer->Max).y;
    auVar19 = minps(auVar18,auVar19);
    fVar17 = auVar19._0_4_ - fVar17;
    fVar20 = auVar19._4_4_ - fVar20;
    uVar10 = -(uint)(fVar15 <= fVar17);
    uVar11 = -(uint)(fVar16 <= fVar20);
    IVar13 = (ImVec2)(CONCAT44(~uVar11 & (uint)fVar16,~uVar10 & (uint)fVar15) |
                     CONCAT44((uint)fVar20 & uVar11,(uint)fVar17 & uVar10));
  }
  return IVar13;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopupEx(const ImVec2& ref_pos, const ImVec2& size, ImGuiDir* last_dir, const ImRect& r_outer, const ImRect& r_avoid, ImGuiPopupPositionPolicy policy)
{
    ImVec2 base_pos_clamped = ImClamp(ref_pos, r_outer.Min, r_outer.Max - size);
    //GetForegroundDrawList()->AddRect(r_avoid.Min, r_avoid.Max, IM_COL32(255,0,0,255));
    //GetForegroundDrawList()->AddRect(r_outer.Min, r_outer.Max, IM_COL32(0,255,0,255));

    // Combo Box policy (we want a connecting edge)
    if (policy == ImGuiPopupPositionPolicy_ComboBox)
    {
        const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Down, ImGuiDir_Right, ImGuiDir_Left, ImGuiDir_Up };
        for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
        {
            const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
            if (n != -1 && dir == *last_dir) // Already tried this direction?
                continue;
            ImVec2 pos;
            if (dir == ImGuiDir_Down)  pos = ImVec2(r_avoid.Min.x, r_avoid.Max.y);          // Below, Toward Right (default)
            if (dir == ImGuiDir_Right) pos = ImVec2(r_avoid.Min.x, r_avoid.Min.y - size.y); // Above, Toward Right
            if (dir == ImGuiDir_Left)  pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Max.y); // Below, Toward Left
            if (dir == ImGuiDir_Up)    pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Min.y - size.y); // Above, Toward Left
            if (!r_outer.Contains(ImRect(pos, pos + size)))
                continue;
            *last_dir = dir;
            return pos;
        }
    }

    // Tooltip and Default popup policy
    // (Always first try the direction we used on the last frame, if any)
    if (policy == ImGuiPopupPositionPolicy_Tooltip || policy == ImGuiPopupPositionPolicy_Default)
    {
        const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Right, ImGuiDir_Down, ImGuiDir_Up, ImGuiDir_Left };
        for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
        {
            const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
            if (n != -1 && dir == *last_dir) // Already tried this direction?
                continue;

            const float avail_w = (dir == ImGuiDir_Left ? r_avoid.Min.x : r_outer.Max.x) - (dir == ImGuiDir_Right ? r_avoid.Max.x : r_outer.Min.x);
            const float avail_h = (dir == ImGuiDir_Up ? r_avoid.Min.y : r_outer.Max.y) - (dir == ImGuiDir_Down ? r_avoid.Max.y : r_outer.Min.y);

            // If there not enough room on one axis, there's no point in positioning on a side on this axis (e.g. when not enough width, use a top/bottom position to maximize available width)
            if (avail_w < size.x && (dir == ImGuiDir_Left || dir == ImGuiDir_Right))
                continue;
            if (avail_h < size.y && (dir == ImGuiDir_Up || dir == ImGuiDir_Down))
                continue;

            ImVec2 pos;
            pos.x = (dir == ImGuiDir_Left) ? r_avoid.Min.x - size.x : (dir == ImGuiDir_Right) ? r_avoid.Max.x : base_pos_clamped.x;
            pos.y = (dir == ImGuiDir_Up) ? r_avoid.Min.y - size.y : (dir == ImGuiDir_Down) ? r_avoid.Max.y : base_pos_clamped.y;

            // Clamp top-left corner of popup
            pos.x = ImMax(pos.x, r_outer.Min.x);
            pos.y = ImMax(pos.y, r_outer.Min.y);

            *last_dir = dir;
            return pos;
        }
    }

    // Fallback when not enough room:
    *last_dir = ImGuiDir_None;

    // For tooltip we prefer avoiding the cursor at all cost even if it means that part of the tooltip won't be visible.
    if (policy == ImGuiPopupPositionPolicy_Tooltip)
        return ref_pos + ImVec2(2, 2);

    // Otherwise try to keep within display
    ImVec2 pos = ref_pos;
    pos.x = ImMax(ImMin(pos.x + size.x, r_outer.Max.x) - size.x, r_outer.Min.x);
    pos.y = ImMax(ImMin(pos.y + size.y, r_outer.Max.y) - size.y, r_outer.Min.y);
    return pos;
}